

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkIvyResyn(Abc_Ntk_t *pNtk,int fUpdateLevel,int fVerbose)

{
  Ivy_Man_t *pMan_00;
  Ivy_Man_t *pMan_01;
  Ivy_Man_t *pTemp;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fUpdateLevel_local;
  Abc_Ntk_t *pNtk_local;
  
  pMan_00 = Abc_NtkIvyBefore(pNtk,0,0);
  if (pMan_00 == (Ivy_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_01 = Ivy_ManResyn(pMan_00,fUpdateLevel,fVerbose);
    Ivy_ManStop(pMan_00);
    pNtk_local = Abc_NtkIvyAfter(pNtk,pMan_01,0,0);
    Ivy_ManStop(pMan_01);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyResyn( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    pMan = Ivy_ManResyn( pTemp = pMan, fUpdateLevel, fVerbose );
    Ivy_ManStop( pTemp );
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}